

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EAMAdapter.cpp
# Opt level: O2

void __thiscall
OpenMD::EAMAdapter::makeZhou2004
          (EAMAdapter *this,string *latticeType,RealType re,RealType fe,RealType rhoe,RealType rhos,
          RealType alpha,RealType beta,RealType A,RealType B,RealType kappa,RealType lambda,
          vector<double,_std::allocator<double>_> *Fn,vector<double,_std::allocator<double>_> *F,
          RealType eta,RealType Fe,RealType rhol,RealType rhoh)

{
  AtomType *pAVar1;
  undefined8 uVar2;
  bool bVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  RealType local_1c8;
  RealType local_1c0;
  RealType local_1b8;
  RealType local_1b0;
  RealType local_1a8;
  RealType local_1a0;
  shared_ptr<OpenMD::GenericData> local_198;
  shared_ptr<OpenMD::GenericData> local_188;
  undefined4 local_170;
  undefined1 *local_168;
  undefined8 local_160;
  undefined1 local_158 [16];
  double local_148;
  ZhouParameters local_140;
  
  local_1e8.field_2._M_allocated_capacity = (size_type)re;
  local_1e8.field_2._8_8_ = rhos;
  local_1c8 = fe;
  local_1c0 = rhoe;
  local_1b8 = alpha;
  local_1b0 = beta;
  local_1a8 = A;
  local_1a0 = B;
  bVar3 = isEAM(this);
  if (bVar3) {
    AtomType::removeProperty(this->at_,(string *)EAMtypeID_abi_cxx11_);
    AtomType::removeProperty(this->at_,(string *)ZhouTypeID_abi_cxx11_);
  }
  local_168 = local_158;
  local_160 = 0;
  local_158[0] = 0;
  local_148 = 0.0;
  memset(&local_140,0,0x110);
  local_170 = 2;
  std::locale::locale((locale *)&local_1e8);
  toUpper<std::__cxx11::string>(latticeType,(locale *)&local_1e8);
  std::locale::~locale((locale *)&local_1e8);
  std::__cxx11::string::_M_assign((string *)&local_168);
  bVar3 = std::operator==(latticeType,"HCP");
  uVar2 = local_1e8.field_2._M_allocated_capacity;
  if (!bVar3) {
    bVar3 = std::operator==(latticeType,"BCC");
    if (bVar3) {
      uVar2 = ((double)local_1e8.field_2._M_allocated_capacity + (double)local_1e8.field_2._0_8_) /
              1.7320508075688772;
    }
    else {
      uVar2 = ((double)local_1e8.field_2._M_allocated_capacity + (double)local_1e8.field_2._0_8_) /
              1.4142135623730951;
    }
  }
  local_140.fe = local_1c8;
  local_140.rhoe = local_1c0;
  local_140.alpha = local_1b8;
  local_140.beta = local_1b0;
  local_140.A = local_1a8;
  local_140.B = local_1a0;
  local_140.kappa = kappa;
  local_140.lambda = lambda;
  local_148 = (double)uVar2;
  local_140.re = (RealType)local_1e8.field_2._M_allocated_capacity;
  std::vector<double,_std::allocator<double>_>::operator=(&local_140.Fn,Fn);
  std::vector<double,_std::allocator<double>_>::operator=(&local_140.F,F);
  local_140.eta = eta;
  local_140.Fe = Fe;
  local_140.rhos = (RealType)local_1e8.field_2._8_8_;
  local_140.rhol = rhol;
  local_140.rhoh = rhoh;
  pAVar1 = this->at_;
  std::
  make_shared<OpenMD::SimpleTypeData<OpenMD::EAMParameters>,std::__cxx11::string_const&,OpenMD::EAMParameters&>
            (&local_1e8,(EAMParameters *)EAMtypeID_abi_cxx11_);
  local_188.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_1e8._M_dataplus._M_p;
  local_188.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1e8._M_string_length;
  local_1e8._M_dataplus._M_p = (pointer)0x0;
  local_1e8._M_string_length = 0;
  AtomType::addProperty(pAVar1,&local_188);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_188.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_1e8._M_string_length);
  pAVar1 = this->at_;
  std::
  make_shared<OpenMD::SimpleTypeData<OpenMD::ZhouParameters>,std::__cxx11::string_const&,OpenMD::ZhouParameters&>
            (&local_1e8,(ZhouParameters *)ZhouTypeID_abi_cxx11_);
  local_198.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_1e8._M_dataplus._M_p;
  local_198.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1e8._M_string_length;
  local_1e8._M_dataplus._M_p = (pointer)0x0;
  local_1e8._M_string_length = 0;
  AtomType::addProperty(pAVar1,&local_198);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_198.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_1e8._M_string_length);
  ZhouParameters::~ZhouParameters(&local_140);
  std::__cxx11::string::~string((string *)&local_168);
  return;
}

Assistant:

void EAMAdapter::makeZhou2004(std::string latticeType, RealType re,
                                RealType fe, RealType rhoe, RealType rhos,
                                RealType alpha, RealType beta, RealType A,
                                RealType B, RealType kappa, RealType lambda,
                                std::vector<RealType> Fn,
                                std::vector<RealType> F, RealType eta,
                                RealType Fe, RealType rhol, RealType rhoh) {
    if (isEAM()) {
      at_->removeProperty(EAMtypeID);
      at_->removeProperty(ZhouTypeID);
    }

    EAMParameters eamParam {};
    ZhouParameters zhouParam {};

    eamParam.eamType = eamZhou2004;

    toUpper(latticeType);
    eamParam.latticeType = latticeType;
    // default to FCC if we don't specify HCP or BCC:
    if (latticeType == "HCP")
      eamParam.latticeConstant = re;
    else if (latticeType == "BCC")
      eamParam.latticeConstant = 2.0 * re / sqrt(3.0);
    else
      eamParam.latticeConstant = 2.0 * re / sqrt(2.0);

    zhouParam.re     = re;
    zhouParam.fe     = fe;
    zhouParam.rhoe   = rhoe;
    zhouParam.alpha  = alpha;
    zhouParam.beta   = beta;
    zhouParam.A      = A;
    zhouParam.B      = B;
    zhouParam.kappa  = kappa;
    zhouParam.lambda = lambda;
    zhouParam.Fn     = Fn;
    zhouParam.F      = F;
    zhouParam.eta    = eta;
    zhouParam.Fe     = Fe;
    zhouParam.rhos   = rhos;
    zhouParam.rhol   = rhol;
    zhouParam.rhoh   = rhoh;

    at_->addProperty(std::make_shared<EAMData>(EAMtypeID, eamParam));
    at_->addProperty(std::make_shared<ZhouData>(ZhouTypeID, zhouParam));
  }